

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFadds.c
# Opt level: O2

Vec_Int_t * Gia_ManCreateMap(Gia_Man_t *p,Vec_Int_t *vFadds)

{
  int i;
  Vec_Int_t *p_00;
  int Entry;
  int i_00;
  
  p_00 = Vec_IntStartFull(p->nObjs);
  i_00 = 4;
  for (Entry = 0; Entry < vFadds->nSize / 5; Entry = Entry + 1) {
    i = Vec_IntEntry(vFadds,i_00);
    Vec_IntWriteEntry(p_00,i,Entry);
    i_00 = i_00 + 5;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCreateMap( Gia_Man_t * p, Vec_Int_t * vFadds )
{
    Vec_Int_t * vMap = Vec_IntStartFull( Gia_ManObjNum(p) );  int i;
    Dtc_ForEachFadd( vFadds, i )
        Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+4), i );
    return vMap;
}